

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
bssl::der::Parser::ReadOptionalTag(Parser *this,CBS_ASN1_TAG tag,optional<bssl::der::Input> *out)

{
  bool bVar1;
  undefined1 local_40 [8];
  Input value;
  CBS_ASN1_TAG actual_tag;
  optional<bssl::der::Input> *out_local;
  CBS_ASN1_TAG tag_local;
  Parser *this_local;
  
  bVar1 = HasMore(this);
  if (bVar1) {
    Input::Input((Input *)local_40);
    bVar1 = PeekTagAndValue(this,(CBS_ASN1_TAG *)&value.data_.size_,(Input *)local_40);
    if (bVar1) {
      if ((CBS_ASN1_TAG)value.data_.size_ == tag) {
        bVar1 = Advance(this);
        if (!bVar1) {
          abort();
        }
        ::std::optional<bssl::der::Input>::operator=(out,(Input *)local_40);
      }
      else {
        this->advance_len_ = 0;
        ::std::optional<bssl::der::Input>::operator=(out);
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    ::std::optional<bssl::der::Input>::operator=(out);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::ReadOptionalTag(CBS_ASN1_TAG tag, std::optional<Input> *out) {
  if (!HasMore()) {
    *out = std::nullopt;
    return true;
  }
  CBS_ASN1_TAG actual_tag;
  Input value;
  if (!PeekTagAndValue(&actual_tag, &value)) {
    return false;
  }
  if (actual_tag == tag) {
    BSSL_CHECK(Advance());
    *out = value;
  } else {
    advance_len_ = 0;
    *out = std::nullopt;
  }
  return true;
}